

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.h
# Opt level: O2

int __thiscall
Nova::Boundary_Uniform<float,_3>::Boundary_Side
          (Boundary_Uniform<float,_3> *this,int side,Range<int,_3> *region)

{
  int *piVar1;
  Range<int,_3> *this_00;
  
  this_00 = (Range<int,_3> *)&region->max_corner;
  if ((side & 1U) != 0) {
    this_00 = region;
  }
  piVar1 = Vector<int,_3,_true>::operator[](&this_00->min_corner,side / 2);
  return (-(side & 1U) | 1) + *piVar1;
}

Assistant:

int Boundary_Side(const int side,const Range<int,d>& region) const
    {int axis=side/2;return (side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;}